

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::segment::ClusteredCharts::mergeCharts(ClusteredCharts *this)

{
  int iVar1;
  Chart *owner;
  AtlasData *pAVar2;
  bool bVar3;
  Chart *chart_00;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Chart **ppCVar8;
  uint *puVar9;
  float *pfVar10;
  uint32_t *puVar11;
  int *piVar12;
  float fVar13;
  float fVar14;
  uint32_t local_7c;
  uint32_t i_1;
  uint32_t faceCount_1;
  int c_1;
  Chart *local_68;
  Chart *chart2;
  uint32_t local_58;
  int cc;
  int neighborChart;
  float l;
  FaceEdgeIterator it;
  uint32_t f;
  uint32_t i;
  uint32_t faceCount;
  float externalBoundaryLength;
  Chart *chart;
  int c;
  bool merged;
  uint32_t chartCount;
  ClusteredCharts *this_local;
  
  uVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::size(&this->m_charts);
  do {
    bVar3 = false;
    chart._4_4_ = uVar5;
    do {
      do {
        chart._4_4_ = chart._4_4_ - 1;
        if ((int)chart._4_4_ < 0) goto LAB_00141831;
        ppCVar8 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                            (&this->m_charts,chart._4_4_);
        owner = *ppCVar8;
      } while (owner == (Chart *)0x0);
      i = 0;
      Array<float>::resize(&this->m_sharedBoundaryLengths,uVar5);
      Array<float>::zeroOutMemory(&this->m_sharedBoundaryLengths);
      Array<float>::resize(&this->m_sharedBoundaryLengthsNoSeams,uVar5);
      Array<float>::zeroOutMemory(&this->m_sharedBoundaryLengthsNoSeams);
      Array<unsigned_int>::resize(&this->m_sharedBoundaryEdgeCountNoSeams,uVar5);
      Array<unsigned_int>::zeroOutMemory(&this->m_sharedBoundaryEdgeCountNoSeams);
      uVar6 = Array<unsigned_int>::size(&owner->faces);
      for (it._20_4_ = 0; uVar7 = uVar5, (uint)it._20_4_ < uVar6; it._20_4_ = it._20_4_ + 1) {
        puVar9 = Array<unsigned_int>::operator[](&owner->faces,it._20_4_);
        it.m_relativeEdge = *puVar9;
        Mesh::FaceEdgeIterator::FaceEdgeIterator
                  ((FaceEdgeIterator *)&neighborChart,this->m_data->mesh,it.m_relativeEdge);
        while (bVar4 = Mesh::FaceEdgeIterator::isDone((FaceEdgeIterator *)&neighborChart),
              ((bVar4 ^ 0xffU) & 1) != 0) {
          pAVar2 = this->m_data;
          uVar7 = Mesh::FaceEdgeIterator::edge((FaceEdgeIterator *)&neighborChart);
          pfVar10 = Array<float>::operator[](&pAVar2->edgeLengths,uVar7);
          cc = (int)*pfVar10;
          bVar4 = Mesh::FaceEdgeIterator::isBoundary((FaceEdgeIterator *)&neighborChart);
          if (bVar4) {
            i = (uint32_t)((float)cc + (float)i);
          }
          else {
            uVar7 = Mesh::FaceEdgeIterator::oppositeFace((FaceEdgeIterator *)&neighborChart);
            puVar11 = (uint32_t *)Array<int>::operator[](&this->m_faceCharts,uVar7);
            local_58 = *puVar11;
            if (local_58 == 0xffffffff) {
              i = (uint32_t)((float)cc + (float)i);
            }
            else {
              ppCVar8 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                                  (&this->m_charts,local_58);
              if (*ppCVar8 != owner) {
                bVar4 = Mesh::FaceEdgeIterator::isSeam((FaceEdgeIterator *)&neighborChart);
                if (bVar4) {
                  uVar7 = Mesh::FaceEdgeIterator::edge((FaceEdgeIterator *)&neighborChart);
                  bVar4 = isNormalSeam(this,uVar7);
                  if ((!bVar4) &&
                     (bVar4 = Mesh::FaceEdgeIterator::isTextureSeam
                                        ((FaceEdgeIterator *)&neighborChart), !bVar4))
                  goto LAB_00141452;
                  i = (uint32_t)((float)cc + (float)i);
                }
                else {
LAB_00141452:
                  iVar1 = cc;
                  pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengths,local_58);
                  *pfVar10 = (float)iVar1 + *pfVar10;
                }
                iVar1 = cc;
                pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengthsNoSeams,local_58);
                *pfVar10 = (float)iVar1 + *pfVar10;
                puVar9 = Array<unsigned_int>::operator[]
                                   (&this->m_sharedBoundaryEdgeCountNoSeams,local_58);
                *puVar9 = *puVar9 + 1;
              }
            }
          }
          Mesh::FaceEdgeIterator::advance((FaceEdgeIterator *)&neighborChart);
        }
      }
LAB_001414f9:
      do {
        do {
          do {
            chart2._4_4_ = uVar7 - 1;
            if ((int)chart2._4_4_ < 0) goto LAB_00141819;
            uVar7 = chart2._4_4_;
          } while (chart2._4_4_ == chart._4_4_);
          ppCVar8 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                              (&this->m_charts,chart2._4_4_);
          local_68 = *ppCVar8;
          uVar7 = chart2._4_4_;
        } while (((((local_68 == (Chart *)0x0) ||
                   (pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengths,chart2._4_4_),
                   uVar7 = chart2._4_4_, *pfVar10 <= 0.0)) ||
                  (fVar13 = dot(&(local_68->basis).normal,&(owner->basis).normal),
                  uVar7 = chart2._4_4_, fVar13 < 0.5)) ||
                 ((0.0 < (this->m_data->options).maxChartArea &&
                  (fVar13 = owner->area + local_68->area,
                  pfVar10 = &(this->m_data->options).maxChartArea,
                  *pfVar10 <= fVar13 && fVar13 != *pfVar10)))) ||
                ((0.0 < (this->m_data->options).maxBoundaryLength &&
                 (fVar13 = owner->boundaryLength, fVar14 = local_68->boundaryLength,
                 pfVar10 = Array<float>::operator[]
                                     (&this->m_sharedBoundaryLengthsNoSeams,chart2._4_4_),
                 fVar13 = (fVar13 + fVar14) - *pfVar10,
                 pfVar10 = &(this->m_data->options).maxBoundaryLength, uVar7 = chart2._4_4_,
                 *pfVar10 <= fVar13 && fVar13 != *pfVar10))));
        pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengthsNoSeams,chart2._4_4_);
        if (((((*pfVar10 <= 0.0) || (uVar6 = Array<unsigned_int>::size(&owner->faces), uVar6 < 2))
             || (uVar6 = Array<unsigned_int>::size(&local_68->faces), uVar6 != 1)) ||
            (owner->area * 0.1 < local_68->area)) &&
           ((uVar6 = Array<unsigned_int>::size(&local_68->faces), uVar6 != 2 ||
            (puVar9 = Array<unsigned_int>::operator[]
                                (&this->m_sharedBoundaryEdgeCountNoSeams,chart2._4_4_), *puVar9 < 2)
            ))) {
          pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengthsNoSeams,chart2._4_4_);
          if (0.0 < *pfVar10) {
            pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengthsNoSeams,chart2._4_4_);
            bVar4 = equal(*pfVar10,local_68->boundaryLength,0.0001);
            if (bVar4) goto LAB_001417bb;
          }
          pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengths,chart2._4_4_);
          fVar13 = *pfVar10;
          c_1 = 0;
          faceCount_1 = (uint32_t)(owner->boundaryLength - (float)i);
          fVar14 = max<float>((float *)&c_1,(float *)&faceCount_1);
          bVar4 = true;
          if (fVar13 <= fVar14 * 0.2) {
            pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengths,chart2._4_4_);
            bVar4 = local_68->boundaryLength * 0.75 < *pfVar10;
          }
          uVar7 = chart2._4_4_;
          if (!bVar4) goto LAB_001414f9;
        }
LAB_001417bb:
        chart_00 = local_68;
        pfVar10 = Array<float>::operator[](&this->m_sharedBoundaryLengthsNoSeams,chart2._4_4_);
        bVar4 = mergeChart(this,owner,chart_00,*pfVar10);
        uVar7 = chart2._4_4_;
      } while (!bVar4);
      bVar3 = true;
LAB_00141819:
    } while (!bVar3);
LAB_00141831:
    if (!bVar3) {
      i_1 = 0;
      do {
        while( true ) {
          uVar5 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::size(&this->m_charts);
          if ((int)uVar5 <= (int)i_1) {
            return;
          }
          ppCVar8 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                              (&this->m_charts,i_1);
          if (*ppCVar8 == (Chart *)0x0) break;
          ppCVar8 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::operator[]
                              (&this->m_charts,i_1);
          (*ppCVar8)->id = i_1;
          i_1 = i_1 + 1;
        }
        Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::removeAt(&this->m_charts,i_1);
        uVar5 = Array<int>::size(&this->m_faceCharts);
        for (local_7c = 0; local_7c < uVar5; local_7c = local_7c + 1) {
          puVar11 = (uint32_t *)Array<int>::operator[](&this->m_faceCharts,local_7c);
          if (*puVar11 == i_1) {
            __assert_fail("m_faceCharts[i] != c",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                          ,0x15ec,"void xatlas::internal::segment::ClusteredCharts::mergeCharts()");
          }
          piVar12 = Array<int>::operator[](&this->m_faceCharts,local_7c);
          iVar1 = *piVar12;
          uVar6 = Array<xatlas::internal::segment::ClusteredCharts::Chart_*>::size(&this->m_charts);
          if ((int)uVar6 < iVar1) {
            __assert_fail("m_faceCharts[i] <= int32_t(m_charts.size())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                          ,0x15ed,"void xatlas::internal::segment::ClusteredCharts::mergeCharts()");
          }
          piVar12 = Array<int>::operator[](&this->m_faceCharts,local_7c);
          if ((int)i_1 < *piVar12) {
            piVar12 = Array<int>::operator[](&this->m_faceCharts,local_7c);
            *piVar12 = *piVar12 + -1;
          }
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void mergeCharts()
	{
		XA_PROFILE_START(clusteredChartsMerge)
		const uint32_t chartCount = m_charts.size();
		// Merge charts progressively until there's none left to merge.
		for (;;) {
			bool merged = false;
			for (int c = chartCount - 1; c >= 0; c--) {
				Chart *chart = m_charts[c];
				if (chart == nullptr)
					continue;
				float externalBoundaryLength = 0.0f;
				m_sharedBoundaryLengths.resize(chartCount);
				m_sharedBoundaryLengths.zeroOutMemory();
				m_sharedBoundaryLengthsNoSeams.resize(chartCount);
				m_sharedBoundaryLengthsNoSeams.zeroOutMemory();
				m_sharedBoundaryEdgeCountNoSeams.resize(chartCount);
				m_sharedBoundaryEdgeCountNoSeams.zeroOutMemory();
				const uint32_t faceCount = chart->faces.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					const uint32_t f = chart->faces[i];
					for (Mesh::FaceEdgeIterator it(m_data.mesh, f); !it.isDone(); it.advance()) {
						const float l = m_data.edgeLengths[it.edge()];
						if (it.isBoundary()) {
							externalBoundaryLength += l;
						} else {
							const int neighborChart = m_faceCharts[it.oppositeFace()];
							if (neighborChart == -1)
								externalBoundaryLength += l;
							else if (m_charts[neighborChart] != chart) {
								if ((it.isSeam() && (isNormalSeam(it.edge()) || it.isTextureSeam()))) {
									externalBoundaryLength += l;
								} else {
									m_sharedBoundaryLengths[neighborChart] += l;
								}
								m_sharedBoundaryLengthsNoSeams[neighborChart] += l;
								m_sharedBoundaryEdgeCountNoSeams[neighborChart]++;
							}
						}
					}
				}
				for (int cc = chartCount - 1; cc >= 0; cc--) {
					if (cc == c)
						continue;
					Chart *chart2 = m_charts[cc];
					if (chart2 == nullptr)
						continue;
					// Must share a boundary.
					if (m_sharedBoundaryLengths[cc] <= 0.0f)
						continue;
					// Compare proxies.
					if (dot(chart2->basis.normal, chart->basis.normal) < XA_MERGE_CHARTS_MIN_NORMAL_DEVIATION)
						continue;
					// Obey max chart area and boundary length.
					if (m_data.options.maxChartArea > 0.0f && chart->area + chart2->area > m_data.options.maxChartArea)
						continue;
					if (m_data.options.maxBoundaryLength > 0.0f && chart->boundaryLength + chart2->boundaryLength - m_sharedBoundaryLengthsNoSeams[cc] > m_data.options.maxBoundaryLength)
						continue;
					// Merge if chart2 has a single face.
					// chart1 must have more than 1 face.
					// chart2 area must be <= 10% of chart1 area.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && chart->faces.size() > 1 && chart2->faces.size() == 1 && chart2->area <= chart->area * 0.1f)
						goto merge;
					// Merge if chart2 has two faces (probably a quad), and chart1 bounds at least 2 of its edges.
					if (chart2->faces.size() == 2 && m_sharedBoundaryEdgeCountNoSeams[cc] >= 2)
						goto merge;
					// Merge if chart2 is wholely inside chart1, ignoring seams.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && equal(m_sharedBoundaryLengthsNoSeams[cc], chart2->boundaryLength, kEpsilon))
						goto merge;
					if (m_sharedBoundaryLengths[cc] > 0.2f * max(0.0f, chart->boundaryLength - externalBoundaryLength) ||
						m_sharedBoundaryLengths[cc] > 0.75f * chart2->boundaryLength)
						goto merge;
					continue;
				merge:
					if (!mergeChart(chart, chart2, m_sharedBoundaryLengthsNoSeams[cc]))
						continue;
					merged = true;
					break;
				}
				if (merged)
					break;
			}
			if (!merged)
				break;
		}
		// Remove deleted charts.
		for (int c = 0; c < int32_t(m_charts.size()); /*do not increment if removed*/) {
			if (m_charts[c] == nullptr) {
				m_charts.removeAt(c);
				// Update m_faceCharts.
				const uint32_t faceCount = m_faceCharts.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					XA_DEBUG_ASSERT(m_faceCharts[i] != c);
					XA_DEBUG_ASSERT(m_faceCharts[i] <= int32_t(m_charts.size()));
					if (m_faceCharts[i] > c) {
						m_faceCharts[i]--;
					}
				}
			} else {
				m_charts[c]->id = c;
				c++;
			}
		}
		XA_PROFILE_END(clusteredChartsMerge)
	}